

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi.cpp
# Opt level: O3

uint m68k_read_disassembler_32(uint addr)

{
  return (uint)musashiMem[addr + 3 & 0xffff] |
         (uint)musashiMem[addr + 1 & 0xffff] << 0x10 | (uint)musashiMem[addr & 0xffff] << 0x18 |
         (uint)musashiMem[addr + 2 & 0xffff] << 8;
}

Assistant:

unsigned int m68k_read_disassembler_32 (unsigned int addr)
{
    return m68k_read_memory_16(addr) << 16 | m68k_read_memory_16(addr + 2);
}